

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O0

void __thiscall rtb::Concurrency::Queue<int>::subscribe(Queue<int> *this)

{
  bool bVar1;
  reverse_iterator<std::_List_iterator<std::optional<int>_>_> *this_00;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  key_type local_68;
  key_type local_60;
  list<std::optional<int>,_std::allocator<std::optional<int>_>_> local_58;
  key_type local_30;
  _List_node_base *local_28;
  undefined1 local_20 [8];
  unique_lock<std::mutex> mlock;
  Queue<int> *this_local;
  
  mlock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex_);
  bVar1 = std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::empty
                    (&this->queue_);
  if (bVar1) {
    local_28 = (_List_node_base *)
               std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::end
                         (&this->queue_);
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar2 = std::
             map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
             ::operator[](&this->subscribersNextRead_,&local_30);
    pmVar2->_M_node = local_28;
    local_58.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
    _M_node._M_size = (size_t)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,
                          (key_type *)
                          &local_58.
                           super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>
                           ._M_impl._M_node._M_size);
    *pmVar3 = 0;
  }
  else {
    std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::rbegin(&local_58);
    this_00 = std::reverse_iterator<std::_List_iterator<std::optional<int>_>_>::operator++
                        ((reverse_iterator<std::_List_iterator<std::optional<int>_>_> *)&local_58);
    local_58.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
    _M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         std::reverse_iterator<std::_List_iterator<std::optional<int>_>_>::base(this_00);
    local_60._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar2 = std::
             map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
             ::operator[](&this->subscribersNextRead_,&local_60);
    pmVar2->_M_node =
         local_58.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl
         ._M_node.super__List_node_base._M_prev;
    local_68._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,&local_68);
    *pmVar3 = 1;
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void Queue<T>::subscribe() {
        std::unique_lock<std::mutex> mlock(mutex_);
        if (queue_.empty()) {
            subscribersNextRead_[std::this_thread::get_id()] = queue_.end();
            subscribersMissingRead_[std::this_thread::get_id()] = 0;
        } else {
            subscribersNextRead_[std::this_thread::get_id()] = (++queue_.rbegin()).base();
            subscribersMissingRead_[std::this_thread::get_id()] = 1;
        }
        mlock.unlock();
    }